

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# converter.cpp
# Opt level: O1

void __thiscall ChannelConverter::convert(ChannelConverter *this,void *src,float *dst,ALuint frames)

{
  int *piVar1;
  short *psVar2;
  ushort *puVar3;
  char *pcVar4;
  float *pfVar5;
  uint *puVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  SampleType *ssrc;
  uint uVar10;
  bool bVar11;
  float fVar12;
  
  uVar10 = this->mChanMask;
  if (this->mDstChans == DevFmtMono) {
    if (this->mSrcType < (DevFmtFloat|DevFmtUByte)) {
      uVar9 = uVar10 - (uVar10 >> 1 & 0x55555555);
      uVar9 = (uVar9 >> 2 & 0x33333333) + (uVar9 & 0x33333333);
      fVar12 = SQRT(1.0 / (float)(((uVar9 >> 4) + uVar9 & 0xf0f0f0f) * 0x1010101 >> 0x18));
      switch(this->mSrcType) {
      case DevFmtByte:
        uVar9 = this->mSrcStep;
        uVar8 = (ulong)frames;
        if (frames != 0) {
          memset(dst,0,uVar8 * 4);
        }
        if (uVar10 != 0) {
          do {
            if (((uVar10 & 1) != 0) && (frames != 0)) {
              uVar7 = 0;
              pcVar4 = (char *)src;
              do {
                dst[uVar7] = (float)(int)*pcVar4 * 0.0078125 + dst[uVar7];
                uVar7 = uVar7 + 1;
                pcVar4 = pcVar4 + uVar9;
              } while (uVar8 != uVar7);
            }
            src = (void *)((long)src + 1);
            bVar11 = 1 < uVar10;
            uVar10 = uVar10 >> 1;
          } while (bVar11);
        }
        if (frames != 0) {
          uVar7 = 0;
          do {
            dst[uVar7] = dst[uVar7] * fVar12;
            uVar7 = uVar7 + 1;
          } while (uVar8 != uVar7);
        }
        break;
      case DevFmtUByte:
        uVar9 = this->mSrcStep;
        uVar8 = (ulong)frames;
        if (frames != 0) {
          memset(dst,0,uVar8 * 4);
        }
        if (uVar10 != 0) {
          do {
            if (((uVar10 & 1) != 0) && (frames != 0)) {
              uVar7 = 0;
              pcVar4 = (char *)src;
              do {
                dst[uVar7] = (float)(int)(char)(*pcVar4 + -0x80) * 0.0078125 + dst[uVar7];
                uVar7 = uVar7 + 1;
                pcVar4 = pcVar4 + uVar9;
              } while (uVar8 != uVar7);
            }
            src = (void *)((long)src + 1);
            bVar11 = 1 < uVar10;
            uVar10 = uVar10 >> 1;
          } while (bVar11);
        }
        if (frames != 0) {
          uVar7 = 0;
          do {
            dst[uVar7] = dst[uVar7] * fVar12;
            uVar7 = uVar7 + 1;
          } while (uVar8 != uVar7);
        }
        break;
      case DevFmtShort:
        uVar9 = this->mSrcStep;
        uVar8 = (ulong)frames;
        if (frames != 0) {
          memset(dst,0,uVar8 * 4);
        }
        if (uVar10 != 0) {
          do {
            if (((uVar10 & 1) != 0) && (frames != 0)) {
              uVar7 = 0;
              psVar2 = (short *)src;
              do {
                dst[uVar7] = (float)(int)*psVar2 * 3.0517578e-05 + dst[uVar7];
                uVar7 = uVar7 + 1;
                psVar2 = psVar2 + uVar9;
              } while (uVar8 != uVar7);
            }
            src = (void *)((long)src + 2);
            bVar11 = 1 < uVar10;
            uVar10 = uVar10 >> 1;
          } while (bVar11);
        }
        if (frames != 0) {
          uVar7 = 0;
          do {
            dst[uVar7] = dst[uVar7] * fVar12;
            uVar7 = uVar7 + 1;
          } while (uVar8 != uVar7);
        }
        break;
      case DevFmtUShort:
        uVar9 = this->mSrcStep;
        uVar8 = (ulong)frames;
        if (frames != 0) {
          memset(dst,0,uVar8 * 4);
        }
        if (uVar10 != 0) {
          do {
            if (((uVar10 & 1) != 0) && (frames != 0)) {
              uVar7 = 0;
              puVar3 = (ushort *)src;
              do {
                dst[uVar7] = (float)(int)(short)(*puVar3 ^ 0x8000) * 3.0517578e-05 + dst[uVar7];
                uVar7 = uVar7 + 1;
                puVar3 = puVar3 + uVar9;
              } while (uVar8 != uVar7);
            }
            src = (void *)((long)src + 2);
            bVar11 = 1 < uVar10;
            uVar10 = uVar10 >> 1;
          } while (bVar11);
        }
        if (frames != 0) {
          uVar7 = 0;
          do {
            dst[uVar7] = dst[uVar7] * fVar12;
            uVar7 = uVar7 + 1;
          } while (uVar8 != uVar7);
        }
        break;
      case DevFmtInt:
        uVar9 = this->mSrcStep;
        uVar8 = (ulong)frames;
        if (frames != 0) {
          memset(dst,0,uVar8 * 4);
        }
        if (uVar10 != 0) {
          do {
            if (((uVar10 & 1) != 0) && (frames != 0)) {
              uVar7 = 0;
              piVar1 = (int *)src;
              do {
                dst[uVar7] = (float)*piVar1 * 4.656613e-10 + dst[uVar7];
                uVar7 = uVar7 + 1;
                piVar1 = piVar1 + uVar9;
              } while (uVar8 != uVar7);
            }
            src = (void *)((long)src + 4);
            bVar11 = 1 < uVar10;
            uVar10 = uVar10 >> 1;
          } while (bVar11);
        }
        if (frames != 0) {
          uVar7 = 0;
          do {
            dst[uVar7] = dst[uVar7] * fVar12;
            uVar7 = uVar7 + 1;
          } while (uVar8 != uVar7);
        }
        break;
      case DevFmtUInt:
        uVar9 = this->mSrcStep;
        uVar8 = (ulong)frames;
        if (frames != 0) {
          memset(dst,0,uVar8 * 4);
        }
        if (uVar10 != 0) {
          do {
            if (((uVar10 & 1) != 0) && (frames != 0)) {
              uVar7 = 0;
              puVar6 = (uint *)src;
              do {
                dst[uVar7] = (float)(int)(*puVar6 ^ 0x80000000) * 4.656613e-10 + dst[uVar7];
                uVar7 = uVar7 + 1;
                puVar6 = puVar6 + uVar9;
              } while (uVar8 != uVar7);
            }
            src = (void *)((long)src + 4);
            bVar11 = 1 < uVar10;
            uVar10 = uVar10 >> 1;
          } while (bVar11);
        }
        if (frames != 0) {
          uVar7 = 0;
          do {
            dst[uVar7] = dst[uVar7] * fVar12;
            uVar7 = uVar7 + 1;
          } while (uVar8 != uVar7);
        }
        break;
      case DevFmtFloat:
        uVar9 = this->mSrcStep;
        uVar8 = (ulong)frames;
        if (frames != 0) {
          memset(dst,0,uVar8 * 4);
        }
        if (uVar10 != 0) {
          do {
            if (((uVar10 & 1) != 0) && (frames != 0)) {
              uVar7 = 0;
              pfVar5 = (float *)src;
              do {
                dst[uVar7] = *pfVar5 + dst[uVar7];
                uVar7 = uVar7 + 1;
                pfVar5 = pfVar5 + uVar9;
              } while (uVar8 != uVar7);
            }
            src = (void *)((long)src + 4);
            bVar11 = 1 < uVar10;
            uVar10 = uVar10 >> 1;
          } while (bVar11);
        }
        if (frames != 0) {
          uVar7 = 0;
          do {
            dst[uVar7] = dst[uVar7] * fVar12;
            uVar7 = uVar7 + 1;
          } while (uVar8 != uVar7);
        }
      }
    }
  }
  else if (this->mDstChans == DevFmtChannelsDefault && uVar10 == 1) {
    switch(this->mSrcType) {
    case DevFmtByte:
      if (frames != 0) {
        uVar8 = 0;
        do {
          fVar12 = (float)(int)*(char *)((long)src + uVar8) * 0.0078125 * 0.70710677;
          dst[uVar8 * 2] = fVar12;
          dst[uVar8 * 2 + 1] = fVar12;
          uVar8 = uVar8 + 1;
        } while (frames != uVar8);
      }
      break;
    case DevFmtUByte:
      if (frames != 0) {
        uVar8 = 0;
        do {
          fVar12 = (float)(int)(char)(*(char *)((long)src + uVar8) + -0x80) * 0.0078125 * 0.70710677
          ;
          dst[uVar8 * 2] = fVar12;
          dst[uVar8 * 2 + 1] = fVar12;
          uVar8 = uVar8 + 1;
        } while (frames != uVar8);
      }
      break;
    case DevFmtShort:
      if (frames != 0) {
        uVar8 = 0;
        do {
          fVar12 = (float)(int)*(short *)((long)src + uVar8 * 2) * 3.0517578e-05 * 0.70710677;
          dst[uVar8 * 2] = fVar12;
          dst[uVar8 * 2 + 1] = fVar12;
          uVar8 = uVar8 + 1;
        } while (frames != uVar8);
      }
      break;
    case DevFmtUShort:
      if (frames != 0) {
        uVar8 = 0;
        do {
          fVar12 = (float)(int)(short)(*(ushort *)((long)src + uVar8 * 2) ^ 0x8000) * 3.0517578e-05
                   * 0.70710677;
          dst[uVar8 * 2] = fVar12;
          dst[uVar8 * 2 + 1] = fVar12;
          uVar8 = uVar8 + 1;
        } while (frames != uVar8);
      }
      break;
    case DevFmtInt:
      if (frames != 0) {
        uVar8 = 0;
        do {
          fVar12 = (float)*(int *)((long)src + uVar8 * 4) * 4.656613e-10 * 0.70710677;
          dst[uVar8 * 2] = fVar12;
          dst[uVar8 * 2 + 1] = fVar12;
          uVar8 = uVar8 + 1;
        } while (frames != uVar8);
      }
      break;
    case DevFmtUInt:
      if (frames != 0) {
        uVar8 = 0;
        do {
          fVar12 = (float)(int)(*(uint *)((long)src + uVar8 * 4) ^ 0x80000000) * 4.656613e-10 *
                   0.70710677;
          dst[uVar8 * 2] = fVar12;
          dst[uVar8 * 2 + 1] = fVar12;
          uVar8 = uVar8 + 1;
        } while (frames != uVar8);
      }
      break;
    case DevFmtFloat:
      if (frames != 0) {
        uVar8 = 0;
        do {
          fVar12 = *(float *)((long)src + uVar8 * 4) * 0.70710677;
          dst[uVar8 * 2] = fVar12;
          dst[uVar8 * 2 + 1] = fVar12;
          uVar8 = uVar8 + 1;
        } while (frames != uVar8);
      }
    }
  }
  return;
}

Assistant:

void ChannelConverter::convert(const void *src, float *dst, ALuint frames) const
{
    if(mDstChans == DevFmtMono)
    {
        const float scale{std::sqrt(1.0f / static_cast<float>(PopCount(mChanMask)))};
        switch(mSrcType)
        {
#define HANDLE_FMT(T) case T: Multi2Mono<T>(mChanMask, mSrcStep, scale, dst, src, frames); break
        HANDLE_FMT(DevFmtByte);
        HANDLE_FMT(DevFmtUByte);
        HANDLE_FMT(DevFmtShort);
        HANDLE_FMT(DevFmtUShort);
        HANDLE_FMT(DevFmtInt);
        HANDLE_FMT(DevFmtUInt);
        HANDLE_FMT(DevFmtFloat);
#undef HANDLE_FMT
        }
    }
    else if(mChanMask == 0x1 && mDstChans == DevFmtStereo)
    {
        switch(mSrcType)
        {
#define HANDLE_FMT(T) case T: Mono2Stereo<T>(dst, src, frames); break
        HANDLE_FMT(DevFmtByte);
        HANDLE_FMT(DevFmtUByte);
        HANDLE_FMT(DevFmtShort);
        HANDLE_FMT(DevFmtUShort);
        HANDLE_FMT(DevFmtInt);
        HANDLE_FMT(DevFmtUInt);
        HANDLE_FMT(DevFmtFloat);
#undef HANDLE_FMT
        }
    }
}